

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTableBuilderVisitor.cpp
# Opt level: O2

void __thiscall
hdc::SymbolTableBuilderVisitor::visit(SymbolTableBuilderVisitor *this,DotExpression *expression)

{
  Expression *pEVar1;
  SymbolTable *s;
  Type *pTVar2;
  
  pEVar1 = BinaryOperator::getLeft(&expression->super_BinaryOperator);
  (**(pEVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar1,this);
  s = NamedType::getSymbolTable((NamedType *)this->lastType);
  pushSymbolTable(this,s);
  pEVar1 = BinaryOperator::getRight(&expression->super_BinaryOperator);
  (**(pEVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar1,this);
  pEVar1 = BinaryOperator::getRight(&expression->super_BinaryOperator);
  pTVar2 = Expression::getType(pEVar1);
  this->lastType = pTVar2;
  if (pTVar2 != (Type *)0x0) {
    (**(pTVar2->super_ASTNode)._vptr_ASTNode)(pTVar2,this);
  }
  popSymbolTable(this);
  return;
}

Assistant:

void SymbolTableBuilderVisitor::visit(DotExpression* expression) {
    NamedType* t = nullptr;
    SymbolTable* s = nullptr;

    expression->getLeft()->accept(this);
    t = (NamedType*) lastType;
    s = t->getSymbolTable();

    pushSymbolTable(s);
    expression->getRight()->accept(this);
    setLastType(expression->getRight()->getType());
    popSymbolTable();
}